

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

bool BicTest3<Blob<88>,Blob<256>>(pfHash hash,int reps,bool verbose)

{
  long lVar1;
  ulong uVar2;
  int *piVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  void *__s;
  long lVar6;
  void *pvVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined8 in_XMM7_Qb;
  Blob<88> key;
  Blob<256> h2;
  Blob<256> h1;
  Blob<256> d;
  uint local_f8;
  uint local_f4;
  void *local_e0;
  undefined7 local_b8;
  undefined4 uStack_b1;
  Rand local_a8;
  ulong local_98;
  ulong uStack_90;
  ulong uStack_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong uStack_48;
  ulong uStack_40;
  
  local_b8 = 0;
  uStack_b1 = 0;
  local_a8.x = 0x88e23b73;
  local_a8.y = 0x11310f6c;
  local_a8.z = 0x18847f4;
  local_a8.w = 0x1142a2ba;
  local_78 = 0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  local_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  __s = operator_new(0x5800000);
  uVar12 = 0;
  memset(__s,0,0x5800000);
  local_e0 = (void *)((long)__s + 0x10);
  do {
    if ((uVar12 & 7) == 0) {
      putchar(0x2e);
    }
    if (0 < reps) {
      local_f4 = 0;
      do {
        Rand::rand_p(&local_a8,&local_b8,0xb);
        (*hash)(&local_b8,0xb,0,&local_78);
        flipbit(&local_b8,0xb,(uint32_t)uVar12);
        (*hash)(&local_b8,0xb,0,&local_98);
        lVar10 = -0xff;
        local_58 = local_98 ^ local_78;
        uStack_50 = uStack_90 ^ uStack_70;
        uStack_48 = uStack_88 ^ uStack_68;
        uStack_40 = uStack_80 ^ uStack_60;
        pvVar7 = local_e0;
        lVar6 = 0;
        do {
          lVar1 = lVar6 + 1;
          lVar11 = lVar10;
          lVar14 = (long)pvVar7;
          do {
            uVar4 = getbit(&local_58,0x20,(uint32_t)lVar6);
            uVar5 = getbit(&local_58,0x20,(int)lVar11 + 0x100);
            piVar3 = (int *)(lVar14 + (ulong)(uVar5 * 2 | uVar4) * 4);
            *piVar3 = *piVar3 + 1;
            lVar14 = lVar14 + 0x10;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0);
          pvVar7 = (void *)((long)pvVar7 + 0x1010);
          lVar10 = lVar10 + 1;
          lVar6 = lVar1;
        } while (lVar1 != 0xff);
        local_f4 = local_f4 + 1;
      } while (local_f4 != reps);
    }
    local_e0 = (void *)((long)local_e0 + 0x100000);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x58);
  putchar(10);
  auVar22 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar23 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar24 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar15 = 1;
  uVar13 = 0;
  local_f8 = 0;
  local_f4 = 0;
  auVar18 = ZEXT864(0) << 0x40;
  uVar12 = 0;
  local_e0 = __s;
LAB_00157f91:
  uVar2 = uVar12 + 1;
  uVar16 = uVar15;
LAB_00157f9f:
  if (verbose) {
    printf("(%3d,%3d) - ",uVar12 & 0xffffffff,uVar16 & 0xffffffff);
    auVar24 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar23 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar22 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar18 = ZEXT864(auVar18._0_8_);
  }
  uVar9 = 0;
LAB_00157ff0:
  do {
    auVar21 = ZEXT864(0) << 0x40;
    lVar6 = 0;
    do {
      lVar10 = lVar6 * 4;
      lVar6 = lVar6 + 1;
      auVar19._0_8_ =
           (double)*(int *)((long)local_e0 + lVar10 + uVar9 * 0x100000 + uVar16 * 0x10) /
           (double)(reps / 2);
      auVar19._8_8_ = in_XMM7_Qb;
      auVar19 = vfmadd213sd_fma(auVar19,auVar22._0_16_,auVar23._0_16_);
      auVar19 = vandpd_avx(auVar19,auVar24._0_16_);
      auVar19 = vmaxsd_avx(auVar19,auVar21._0_16_);
      auVar21 = ZEXT1664(auVar19);
    } while (lVar6 != 4);
    dVar20 = auVar19._0_8_;
    if (auVar18._0_8_ < dVar20) {
      uVar13 = uVar9 & 0xffffffff;
      auVar18 = ZEXT1664(auVar19);
      local_f8 = (uint)uVar12;
      local_f4 = (uint)uVar16;
    }
    if (!verbose) goto LAB_001580b2;
    iVar8 = 0x2e;
    uVar17 = auVar18._0_8_;
    if ((0.01 <= dVar20) && (iVar8 = 0x6f, 0.05 <= dVar20)) {
      iVar8 = (uint)(0.33 <= dVar20) * 9 + 0x4f;
    }
    putchar(iVar8);
    auVar18 = ZEXT864(uVar17);
    auVar22 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar23 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar24 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x58);
  if (verbose) {
    putchar(10);
    auVar24 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar23 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar22 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar18 = ZEXT864(uVar17);
    uVar16 = uVar16 + 1;
    if (uVar16 == 0x100) {
      iVar8 = 100;
      do {
        putchar(0x2d);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      putchar(10);
      auVar18 = ZEXT864(uVar17);
      auVar22 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar23 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar24 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      goto LAB_00158159;
    }
    goto LAB_00157f9f;
  }
  goto LAB_00158106;
LAB_001580b2:
  uVar9 = uVar9 + 1;
  if (uVar9 == 0x58) goto LAB_00158106;
  goto LAB_00157ff0;
LAB_00158106:
  uVar16 = uVar16 + 1;
  if (uVar16 == 0x100) goto LAB_00158159;
  goto LAB_00157f9f;
LAB_00158159:
  local_e0 = (void *)((long)local_e0 + 0x1000);
  uVar15 = uVar15 + 1;
  uVar12 = uVar2;
  if (uVar2 == 0xff) {
    printf("Max bias %f - (%3d : %3d,%3d)\n",uVar13,(ulong)local_f8,(ulong)local_f4);
    operator_delete(__s);
    return auVar18._0_8_ < 0.05;
  }
  goto LAB_00157f91;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}